

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O1

void __thiscall
fill<16U,_6U,_buffer_layout_dfs>::operator()
          (fill<16U,_6U,_buffer_layout_dfs> *this,array<Stream,_16UL> *streams,uchar **buffer,
          array<unsigned_long,_16UL> *buffer_count)

{
  unsigned_long uVar1;
  uchar *__s1;
  unsigned_long uVar2;
  uchar *__s2;
  array<unsigned_long,_16UL> *buffer_count_00;
  int iVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  long lVar6;
  size_t __n;
  uchar **from0;
  unsigned_long *puVar7;
  fill<16U,_12U,_buffer_layout_dfs> local_74;
  fill<16U,_13U,_buffer_layout_dfs> local_73;
  fill<16U,_13U,_buffer_layout_dfs> local_72;
  fill<16U,_12U,_buffer_layout_dfs> local_71;
  uchar **local_70;
  array<Stream,_16UL> *local_68;
  uchar **local_60;
  unsigned_long *local_58;
  unsigned_long *local_50;
  array<unsigned_long,_16UL> *local_48;
  size_t local_40;
  long local_38;
  
  puVar7 = buffer_count->_M_elems + 0xc;
  local_58 = buffer_count->_M_elems + 0xd;
  local_60 = buffer + 0xf0;
  local_70 = buffer + 0xb0;
  sVar5 = 0;
  lVar6 = 0;
  local_68 = streams;
  local_50 = puVar7;
  local_48 = buffer_count;
  while ((buffer_count_00 = local_48, *puVar7 != 0 ||
         (fill<16U,_12U,_buffer_layout_dfs>::operator()(&local_71,local_68,buffer,local_48),
         buffer_count_00->_M_elems[0xc] != 0))) {
    if ((*local_58 == 0) &&
       (fill<16U,_13U,_buffer_layout_dfs>::operator()(&local_72,local_68,buffer,buffer_count_00),
       buffer_count_00->_M_elems[0xd] == 0)) {
      __n = -lVar6;
      lVar6 = -sVar5;
      goto LAB_0015eb23;
    }
    puVar4 = local_58;
    uVar1 = *puVar7;
    __s1 = buffer[0xf8 - uVar1];
    local_40 = sVar5;
    local_38 = lVar6;
    if (__s1 == (uchar *)0x0) {
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5c,"int cmp(const unsigned char *, const unsigned char *)");
    }
    uVar2 = *local_58;
    __s2 = buffer[0x100 - uVar2];
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                    ,0x5d,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar3 = strcmp((char *)__s1,(char *)__s2);
    sVar5 = local_40;
    puVar7 = local_50;
    if (iVar3 < 1) {
      puVar4 = local_50;
      __s2 = __s1;
      uVar2 = uVar1;
    }
    buffer[local_40 + 0xb0] = __s2;
    *puVar4 = uVar2 - 1;
    check_input(local_70,local_40);
    lVar6 = local_38 + -8;
    sVar5 = sVar5 + 1;
    if (sVar5 == 0x40) {
      local_48->_M_elems[6] = 0x40;
      return;
    }
  }
  __n = -lVar6;
  lVar6 = -sVar5;
  do {
    if ((buffer_count_00->_M_elems[0xd] == 0) &&
       (fill<16U,_13U,_buffer_layout_dfs>::operator()(&local_73,local_68,buffer,buffer_count_00),
       buffer_count_00->_M_elems[0xd] == 0)) goto LAB_0015eb88;
    uVar1 = buffer_count_00->_M_elems[0xd];
    *(uchar **)((long)buffer + __n + 0x580) = buffer[0x100 - uVar1];
    buffer_count_00->_M_elems[0xd] = uVar1 - 1;
    lVar6 = lVar6 + -1;
    __n = __n + 8;
  } while (__n != 0x200);
  goto LAB_0015eb74;
LAB_0015eb88:
  from0 = (uchar **)((long)local_60 - __n);
  sVar5 = -lVar6;
  memmove(local_60 + lVar6,local_70,__n);
  buffer_count_00->_M_elems[6] = sVar5;
  goto LAB_0015ebae;
  while( true ) {
    uVar1 = *puVar7;
    *(uchar **)((long)buffer + __n + 0x580) = buffer[0xf8 - uVar1];
    *puVar7 = uVar1 - 1;
    lVar6 = lVar6 + -1;
    __n = __n + 8;
    if (__n == 0x200) break;
LAB_0015eb23:
    if ((*puVar7 == 0) &&
       (fill<16U,_12U,_buffer_layout_dfs>::operator()(&local_74,local_68,buffer,buffer_count_00),
       buffer_count_00->_M_elems[0xc] == 0)) goto LAB_0015eb88;
  }
LAB_0015eb74:
  buffer_count_00->_M_elems[6] = 0x40;
  sVar5 = 0x40;
  from0 = local_70;
LAB_0015ebae:
  check_input(from0,sVar5);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}